

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

void time_main<trng::mt19937>(mt19937 *r,string *name)

{
  double dVar1;
  stringstream s;
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  while (name->_M_string_length < 0x20) {
    std::__cxx11::string::push_back((char)name);
  }
  std::operator<<((ostream *)&std::cout,(string *)name);
  time_plain<trng::mt19937>(r);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  dVar1 = time_cc<trng::mt19937>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_co<trng::mt19937>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_oc<trng::mt19937>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_oo<trng::mt19937>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_canonical<trng::mt19937,double>(r);
  std::ostream::_M_insert<double>(dVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return;
}

Assistant:

void time_main(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  const auto res_cc = time_cc(r);
  s << res_cc;
  const auto res_co = time_co(r);
  s << res_co;
  const auto res_oc = time_oc(r);
  s << res_oc;
  const auto res_oo = time_oo(r);
  s << res_oo;
  const auto res_canonical = time_canonical<R, double>(r);
  s << res_canonical;
  std::cout << std::endl;
}